

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int expect(frozen *f,char *s,int len,json_type t)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pcVar1 = f->end;
  pcVar2 = f->cur;
  iVar3 = capture_ptr(f,pcVar2,t);
  if (-1 < iVar3) {
    uVar6 = (int)pcVar1 - (int)pcVar2;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < len) {
      uVar5 = (ulong)(uint)len;
    }
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar4;
    }
    do {
      if (uVar5 == uVar4) {
        pcVar1 = f->cur;
        f->cur = pcVar1 + (uint)len;
        iVar3 = capture_len(f,f->num_tokens + -1,pcVar1 + (uint)len);
        return iVar3;
      }
      if (uVar7 == uVar4) {
        return -2;
      }
      pcVar1 = f->cur + uVar4;
      pcVar2 = s + uVar4;
      uVar4 = uVar4 + 1;
    } while (*pcVar1 == *pcVar2);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int expect(struct frozen *f, const char *s, int len, enum json_type t) {
    int i, n = left(f);

    TRY(capture_ptr(f, f->cur, t));
    for (i = 0; i < len; i++) {
        if (i >= n) return JSON_STRING_INCOMPLETE;
        if (f->cur[i] != s[i]) return JSON_STRING_INVALID;
    }
    f->cur += len;
    TRY(capture_len(f, f->num_tokens - 1, f->cur));

    return 0;
}